

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

uint8_t get_filter_level(AV1_COMMON *cm,loop_filter_info_n *lfi_n,int dir_idx,int plane,
                        MB_MODE_INFO *mbmi)

{
  SEG_LVL_FEATURES feature_id;
  byte segment_id_00;
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int scale;
  int data;
  int seg_lf_feature_id;
  int lvl_seg;
  int base_level;
  int delta_lf_idx;
  int8_t delta_lf;
  int segment_id;
  int local_3c;
  int local_38;
  char local_2d;
  uint8_t local_1;
  
  segment_id_00 = (byte)*(undefined2 *)(in_R8 + 0xa7) & 7;
  if (*(int *)(in_RDI + 0x5f58) == 0) {
    local_1 = *(uint8_t *)
               (in_RSI + 0xc00 + (long)in_ECX * 0x100 + (long)(int)(uint)segment_id_00 * 0x20 +
                (long)in_EDX * 0x10 + (long)*(char *)(in_R8 + 0x10) * 2 +
               (long)mode_lf_lut[*(byte *)(in_R8 + 2)]);
  }
  else {
    if (*(int *)(in_RDI + 0x5f60) == 0) {
      local_2d = *(char *)(in_R8 + 0xa2);
    }
    else {
      local_2d = *(char *)(in_R8 + 0xa3 + (long)delta_lf_id_lut[in_ECX][in_EDX]);
    }
    if (in_ECX == 0) {
      local_38 = *(int *)(in_RDI + 0x59f0 + (long)in_EDX * 4);
    }
    else if (in_ECX == 1) {
      local_38 = *(int *)(in_RDI + 0x59f8);
    }
    else {
      local_38 = *(int *)(in_RDI + 0x59fc);
    }
    local_3c = clamp(local_2d + local_38,0,0x3f);
    feature_id = seg_lvl_lf_lut[in_ECX][in_EDX];
    iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),segment_id_00,feature_id);
    if (iVar1 != 0) {
      iVar1 = get_segdata((segmentation *)(in_RDI + 19000),(uint)segment_id_00,feature_id);
      local_3c = clamp(local_3c + iVar1,0,0x3f);
    }
    if (*(char *)(in_RDI + 0x5a14) != '\0') {
      iVar1 = 1 << ((byte)(local_3c >> 5) & 0x1f);
      local_3c = *(char *)(in_RDI + 0x5a16 + (long)*(char *)(in_R8 + 0x10)) * iVar1 + local_3c;
      if ('\0' < *(char *)(in_R8 + 0x10)) {
        local_3c = *(char *)(in_RDI + 0x5a1e + (long)mode_lf_lut[*(byte *)(in_R8 + 2)]) * iVar1 +
                   local_3c;
      }
      local_3c = clamp(local_3c,0,0x3f);
    }
    local_1 = (uint8_t)local_3c;
  }
  return local_1;
}

Assistant:

static uint8_t get_filter_level(const AV1_COMMON *cm,
                                const loop_filter_info_n *lfi_n,
                                const int dir_idx, int plane,
                                const MB_MODE_INFO *mbmi) {
  const int segment_id = mbmi->segment_id;
  if (cm->delta_q_info.delta_lf_present_flag) {
    int8_t delta_lf;
    if (cm->delta_q_info.delta_lf_multi) {
      const int delta_lf_idx = delta_lf_id_lut[plane][dir_idx];
      delta_lf = mbmi->delta_lf[delta_lf_idx];
    } else {
      delta_lf = mbmi->delta_lf_from_base;
    }
    int base_level;
    if (plane == 0)
      base_level = cm->lf.filter_level[dir_idx];
    else if (plane == 1)
      base_level = cm->lf.filter_level_u;
    else
      base_level = cm->lf.filter_level_v;
    int lvl_seg = clamp(delta_lf + base_level, 0, MAX_LOOP_FILTER);
    assert(plane >= 0 && plane <= 2);
    const int seg_lf_feature_id = seg_lvl_lf_lut[plane][dir_idx];
    if (segfeature_active(&cm->seg, segment_id, seg_lf_feature_id)) {
      const int data = get_segdata(&cm->seg, segment_id, seg_lf_feature_id);
      lvl_seg = clamp(lvl_seg + data, 0, MAX_LOOP_FILTER);
    }

    if (cm->lf.mode_ref_delta_enabled) {
      const int scale = 1 << (lvl_seg >> 5);
      lvl_seg += cm->lf.ref_deltas[mbmi->ref_frame[0]] * scale;
      if (mbmi->ref_frame[0] > INTRA_FRAME)
        lvl_seg += cm->lf.mode_deltas[mode_lf_lut[mbmi->mode]] * scale;
      lvl_seg = clamp(lvl_seg, 0, MAX_LOOP_FILTER);
    }
    return lvl_seg;
  } else {
    return lfi_n->lvl[plane][segment_id][dir_idx][mbmi->ref_frame[0]]
                     [mode_lf_lut[mbmi->mode]];
  }
}